

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t,secp256k1_fe *x_in,secp256k1_fe *u_in,int c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_fe *psVar5;
  ulong uVar6;
  secp256k1_fe *a;
  ulong uVar7;
  secp256k1_fe *psVar8;
  ulong uVar9;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar10;
  secp256k1_fe *psVar11;
  secp256k1_fe x;
  secp256k1_fe r;
  secp256k1_fe sStack_240;
  secp256k1_fe sStack_210;
  secp256k1_fe *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  uint local_1c4;
  secp256k1_fe *local_1c0;
  secp256k1_fe local_1b8;
  secp256k1_fe local_188;
  secp256k1_fe local_158;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  local_158.n[0] = x_in->n[0];
  local_158.n[1] = x_in->n[1];
  local_158.n[2] = x_in->n[2];
  local_158.n[3] = x_in->n[3];
  local_158.n[4] = x_in->n[4];
  local_158.magnitude = x_in->magnitude;
  local_158.normalized = x_in->normalized;
  local_128.n[0] = u_in->n[0];
  local_128.n[1] = u_in->n[1];
  local_128.n[2] = u_in->n[2];
  local_128.n[3] = u_in->n[3];
  local_128.n[4] = u_in->n[4];
  local_128.magnitude = u_in->magnitude;
  local_128.normalized = u_in->normalized;
  psVar11 = &local_128;
  psStack_1d0 = (secp256k1_fe *)0x12275e;
  local_1c4 = c;
  local_1c0 = t;
  secp256k1_fe_verify(&local_158);
  uVar3 = (local_158.n[4] >> 0x30) * 0x1000003d1 + local_158.n[0];
  uVar4 = (uVar3 >> 0x34) + local_158.n[1];
  uVar6 = (uVar4 >> 0x34) + local_158.n[2];
  uVar7 = (uVar6 >> 0x34) + local_158.n[3];
  local_158.n[3] = uVar7 & 0xfffffffffffff;
  local_158.n[4] = (uVar7 >> 0x34) + (local_158.n[4] & 0xffffffffffff);
  local_158.n[2] = uVar6 & 0xfffffffffffff;
  local_158.n[1] = uVar4 & 0xfffffffffffff;
  local_158.n[0] = uVar3 & 0xfffffffffffff;
  psVar5 = (secp256k1_fe *)0x1;
  local_158.magnitude = 1;
  psStack_1d0 = (secp256k1_fe *)0x1227ce;
  secp256k1_fe_verify(&local_158);
  psStack_1d0 = (secp256k1_fe *)0x1227d6;
  secp256k1_fe_verify(psVar11);
  uVar1 = local_1c4;
  uVar3 = (local_128.n[4] >> 0x30) * 0x1000003d1 + local_128.n[0];
  uVar4 = (uVar3 >> 0x34) + local_128.n[1];
  uVar6 = (uVar4 >> 0x34) + local_128.n[2];
  uVar7 = (uVar6 >> 0x34) + local_128.n[3];
  local_128.n[3] = uVar7 & 0xfffffffffffff;
  local_128.n[4] = (uVar7 >> 0x34) + (local_128.n[4] & 0xffffffffffff);
  a = (secp256k1_fe *)(uVar6 & 0xfffffffffffff);
  local_128.n[1] = uVar4 & 0xfffffffffffff;
  local_128.n[0] = uVar3 & 0xfffffffffffff;
  local_128.magnitude = 1;
  psStack_1d0 = (secp256k1_fe *)0x122846;
  psVar8 = psVar11;
  local_128.n[2] = (uint64_t)a;
  secp256k1_fe_verify(psVar11);
  if ((int)uVar1 < 0) {
    psStack_1d0 = (secp256k1_fe *)0x1232c5;
    secp256k1_ellswift_xswiftec_inv_var_cold_13();
LAB_001232c5:
    psStack_1d0 = (secp256k1_fe *)0x1232ca;
    secp256k1_ellswift_xswiftec_inv_var_cold_12();
LAB_001232ca:
    psStack_1d0 = (secp256k1_fe *)0x1232cf;
    secp256k1_ellswift_xswiftec_inv_var_cold_11();
LAB_001232cf:
    psStack_1d0 = (secp256k1_fe *)0x1232d4;
    secp256k1_ellswift_xswiftec_inv_var_cold_6();
LAB_001232d4:
    psStack_1d0 = (secp256k1_fe *)0x1232d9;
    secp256k1_ellswift_xswiftec_inv_var_cold_5();
LAB_001232d9:
    psStack_1d0 = (secp256k1_fe *)0x1232de;
    secp256k1_ellswift_xswiftec_inv_var_cold_4();
LAB_001232de:
    psStack_1d0 = (secp256k1_fe *)0x1232e3;
    secp256k1_ellswift_xswiftec_inv_var_cold_3();
LAB_001232e3:
    psStack_1d0 = (secp256k1_fe *)0x1232e8;
    secp256k1_ellswift_xswiftec_inv_var_cold_9();
LAB_001232e8:
    psStack_1d0 = (secp256k1_fe *)0x1232ed;
    secp256k1_ellswift_xswiftec_inv_var_cold_8();
LAB_001232ed:
    psStack_1d0 = (secp256k1_fe *)0x1232f2;
    secp256k1_ellswift_xswiftec_inv_var_cold_2();
LAB_001232f2:
    psStack_1d0 = (secp256k1_fe *)0x1232f7;
    secp256k1_ellswift_xswiftec_inv_var_cold_1();
  }
  else {
    psVar8 = &local_158;
    psStack_1d0 = (secp256k1_fe *)0x122859;
    iVar2 = secp256k1_ge_x_on_curve_var(psVar8);
    if (iVar2 == 0) goto LAB_001232c5;
    if ((uVar1 & 2) != 0) {
      psVar5 = (secp256k1_fe *)0x3fffffffffffc;
      psStack_1d0 = (secp256k1_fe *)0x122c08;
      secp256k1_fe_verify(&local_128);
      a = (secp256k1_fe *)0x1;
      psStack_1d0 = (secp256k1_fe *)0x122c15;
      secp256k1_fe_verify_magnitude(&local_128,1);
      local_188.n[0] = 0x3ffffbfffff0bc - local_128.n[0];
      local_188.n[1] = 0x3ffffffffffffc - local_128.n[1];
      local_188.n[2] = 0x3ffffffffffffc - local_128.n[2];
      local_188.n[3] = 0x3ffffffffffffc - local_128.n[3];
      local_188.n[4] = 0x3fffffffffffc - local_128.n[4];
      local_188.magnitude = 2;
      local_188.normalized = 0;
      psStack_1d0 = (secp256k1_fe *)0x122c5b;
      secp256k1_fe_verify(&local_188);
      psVar11 = &local_1b8;
      local_1b8.n[4] = local_188.n[4];
      local_1b8.magnitude = local_188.magnitude;
      local_1b8.normalized = local_188.normalized;
      local_1b8.n[2] = local_188.n[2];
      local_1b8.n[3] = local_188.n[3];
      local_1b8.n[0] = local_188.n[0];
      local_1b8.n[1] = local_188.n[1];
      psStack_1d0 = (secp256k1_fe *)0x122c84;
      secp256k1_fe_verify(psVar11);
      psVar8 = &local_158;
      psStack_1d0 = (secp256k1_fe *)0x122c91;
      secp256k1_fe_verify(psVar8);
      if (0x20 < local_158.magnitude + local_1b8.magnitude) goto LAB_001232cf;
      local_1b8.n[0] = local_1b8.n[0] + local_158.n[0];
      local_1b8.n[1] = local_1b8.n[1] + local_158.n[1];
      local_1b8.n[2] = local_1b8.n[2] + local_158.n[2];
      local_1b8.n[3] = local_1b8.n[3] + local_158.n[3];
      local_1b8.n[4] = local_1b8.n[4] + local_158.n[4];
      local_1b8.normalized = 0;
      local_1b8.magnitude = local_158.magnitude + local_1b8.magnitude;
      psStack_1d0 = (secp256k1_fe *)0x122cec;
      secp256k1_fe_verify(&local_1b8);
      psStack_1d0 = (secp256k1_fe *)0x122cf4;
      iVar2 = secp256k1_fe_is_square_var(&local_1b8);
      if (iVar2 == 0) {
        psVar11 = (secp256k1_fe *)0x0;
        goto LAB_001232ab;
      }
      psVar11 = &local_c8;
      psStack_1d0 = (secp256k1_fe *)0x122d14;
      secp256k1_fe_sqr(psVar11,&local_128);
      psVar8 = &local_68;
      a = &local_1b8;
      psStack_1d0 = (secp256k1_fe *)0x122d2c;
      secp256k1_fe_mul(psVar8,a,psVar11);
      psStack_1d0 = (secp256k1_fe *)0x122d34;
      secp256k1_fe_verify(psVar8);
      if (10 < local_68.magnitude) goto LAB_001232d4;
      local_68.n[0] = local_68.n[0] * 3;
      local_68.n[1] = local_68.n[1] * 3;
      local_68.n[2] = local_68.n[2] * 3;
      local_68.n[3] = local_68.n[3] * 3;
      local_68.n[4] = local_68.n[4] * 3;
      local_68.normalized = 0;
      local_68.magnitude = local_68.magnitude * 3;
      psStack_1d0 = (secp256k1_fe *)0x122d95;
      secp256k1_fe_verify(&local_68);
      psVar11 = &local_c8;
      psStack_1d0 = (secp256k1_fe *)0x122db0;
      a = psVar11;
      secp256k1_fe_mul(psVar11,psVar11,&local_128);
      psStack_1d0 = (secp256k1_fe *)0x122db8;
      psVar8 = psVar11;
      secp256k1_fe_verify(psVar11);
      if (8 < local_c8.magnitude) goto LAB_001232d9;
      psVar8 = &local_c8;
      local_c8.n[0] = local_c8.n[0] << 2;
      local_c8.n[1] = local_c8.n[1] << 2;
      local_c8.n[2] = local_c8.n[2] << 2;
      local_c8.n[3] = local_c8.n[3] << 2;
      local_c8.n[4] = local_c8.n[4] << 2;
      local_c8.magnitude = local_c8.magnitude << 2;
      psVar11 = (secp256k1_fe *)0x0;
      psVar10 = (secp256k1_fe *)0x0;
      local_c8.normalized = 0;
      psStack_1d0 = (secp256k1_fe *)0x122e08;
      secp256k1_fe_verify(psVar8);
      psStack_1d0 = (secp256k1_fe *)0x122e10;
      secp256k1_fe_verify(psVar8);
      local_c8.n[0] = local_c8.n[0] + 0x1c;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      psStack_1d0 = (secp256k1_fe *)0x122e24;
      secp256k1_fe_verify(psVar8);
      psStack_1d0 = (secp256k1_fe *)0x122e34;
      secp256k1_fe_verify(&local_68);
      psStack_1d0 = (secp256k1_fe *)0x122e3c;
      secp256k1_fe_verify(psVar8);
      if (0x20 < local_c8.magnitude + local_68.magnitude) goto LAB_001232de;
      local_68.n[0] = local_68.n[0] + local_c8.n[0];
      local_68.n[1] = local_68.n[1] + local_c8.n[1];
      local_68.n[2] = local_68.n[2] + local_c8.n[2];
      local_68.n[3] = local_68.n[3] + local_c8.n[3];
      local_68.n[4] = (long)(uint64_t *)local_68.n[4] + local_c8.n[4];
      local_68.normalized = 0;
      local_68.magnitude = local_c8.magnitude + local_68.magnitude;
      psStack_1d0 = (secp256k1_fe *)0x122e9e;
      secp256k1_fe_verify(&local_68);
      psStack_1d0 = (secp256k1_fe *)0x122eae;
      secp256k1_fe_mul(&local_68,&local_68,&local_1b8);
      psStack_1d0 = (secp256k1_fe *)0x122eb6;
      secp256k1_fe_verify(&local_68);
      psStack_1d0 = (secp256k1_fe *)0x122ec3;
      secp256k1_fe_verify_magnitude(&local_68,1);
      local_68.n[0] = 0x3ffffbfffff0bc - local_68.n[0];
      local_68.n[1] = 0x3ffffffffffffc - local_68.n[1];
      local_68.n[2] = 0x3ffffffffffffc - local_68.n[2];
      local_68.n[3] = 0x3ffffffffffffc - local_68.n[3];
      psVar5 = (secp256k1_fe *)(0x3fffffffffffc - local_68.n[4]);
      local_68.magnitude = 2;
      local_68.normalized = 0;
      psStack_1d0 = (secp256k1_fe *)0x122f01;
      local_68.n[4] = (uint64_t)psVar5;
      secp256k1_fe_verify(&local_68);
      psStack_1d0 = (secp256k1_fe *)0x122f09;
      iVar2 = secp256k1_fe_is_square_var(&local_68);
      if (iVar2 == 0) goto LAB_001232ab;
      psVar8 = &local_98;
      a = &local_68;
      psStack_1d0 = (secp256k1_fe *)0x122f26;
      iVar2 = secp256k1_fe_sqrt(psVar8,a);
      r_00 = local_1c0;
      if (iVar2 == 0) goto LAB_001232ed;
      psVar5 = (secp256k1_fe *)0xffffefffffc2f;
      psVar11 = psVar10;
      if ((uVar1 & 1) != 0) {
        psStack_1d0 = (secp256k1_fe *)0x122f57;
        secp256k1_fe_verify(&local_98);
        uVar3 = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
        if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
          uVar4 = (uVar3 >> 0x34) + local_98.n[1];
          uVar6 = (uVar4 >> 0x34) + local_98.n[2];
          uVar7 = (uVar6 >> 0x34) + local_98.n[3];
          uVar9 = (uVar7 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
          if ((((uVar4 | uVar3 | uVar6 | uVar7) & 0xfffffffffffff) == 0 && uVar9 == 0) ||
             ((uVar3 + 0x1000003d0 & uVar4 & uVar6 & uVar7 & (uVar9 ^ 0xf000000000000)) ==
              0xfffffffffffff)) goto LAB_001232ab;
        }
      }
      psStack_1d0 = (secp256k1_fe *)0x123022;
      secp256k1_fe_verify(&local_1b8);
      uVar3 = (local_1b8.n[4] >> 0x30) * 0x1000003d1 + local_1b8.n[0];
      if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
        uVar4 = (uVar3 >> 0x34) + local_1b8.n[1];
        uVar6 = (uVar4 >> 0x34) + local_1b8.n[2];
        uVar7 = (uVar6 >> 0x34) + local_1b8.n[3];
        uVar9 = (uVar7 >> 0x34) + (local_1b8.n[4] & 0xffffffffffff);
        if ((((uVar4 | uVar3 | uVar6 | uVar7) & 0xfffffffffffff) == 0 && uVar9 == 0) ||
           ((uVar3 + 0x1000003d0 & uVar4 & uVar6 & uVar7 & (uVar9 ^ 0xf000000000000)) ==
            0xfffffffffffff)) goto LAB_001232ab;
      }
      psVar11 = &local_f8;
      psStack_1d0 = (secp256k1_fe *)0x1230de;
      secp256k1_fe_inv_var(psVar11,&local_1b8);
      psStack_1d0 = (secp256k1_fe *)0x1230f1;
      a = psVar11;
      secp256k1_fe_mul(psVar11,psVar11,&local_98);
      psStack_1d0 = (secp256k1_fe *)0x1230f9;
      secp256k1_fe_verify(psVar11);
      psVar8 = &local_188;
      psStack_1d0 = (secp256k1_fe *)0x123106;
      secp256k1_fe_verify(psVar8);
      if (local_188.magnitude + local_f8.magnitude < 0x21) {
        psVar11 = &local_f8;
        local_f8.n[0] = local_f8.n[0] + local_188.n[0];
        local_f8.n[1] = local_f8.n[1] + local_188.n[1];
        local_f8.n[2] = local_f8.n[2] + local_188.n[2];
        local_f8.n[3] = local_f8.n[3] + local_188.n[3];
        local_f8.n[4] = local_f8.n[4] + local_188.n[4];
        local_f8.normalized = 0;
        local_f8.magnitude = local_188.magnitude + local_f8.magnitude;
        psStack_1d0 = (secp256k1_fe *)0x12315e;
        secp256k1_fe_verify(psVar11);
        psStack_1d0 = (secp256k1_fe *)0x123166;
        secp256k1_fe_half(psVar11);
        goto LAB_00123166;
      }
      goto LAB_001232f2;
    }
    psVar11 = &local_188;
    local_188.n[4] = local_158.n[4];
    local_188.magnitude = local_158.magnitude;
    local_188.normalized = local_158.normalized;
    local_188.n[2] = local_158.n[2];
    local_188.n[3] = local_158.n[3];
    local_188.n[0] = local_158.n[0];
    local_188.n[1] = local_158.n[1];
    psStack_1d0 = (secp256k1_fe *)0x12289b;
    secp256k1_fe_verify(psVar11);
    psVar8 = &local_128;
    psStack_1d0 = (secp256k1_fe *)0x1228ab;
    secp256k1_fe_verify(psVar8);
    if (0x20 < local_128.magnitude + local_188.magnitude) goto LAB_001232ca;
    local_188.n[0] = local_188.n[0] + local_128.n[0];
    local_188.n[1] = local_188.n[1] + local_128.n[1];
    local_188.n[2] = (long)(uint64_t *)local_128.n[2] + local_188.n[2];
    local_188.n[3] = local_188.n[3] + local_128.n[3];
    local_188.n[4] = local_188.n[4] + local_128.n[4];
    local_188.normalized = 0;
    local_188.magnitude = local_128.magnitude + local_188.magnitude;
    psStack_1d0 = (secp256k1_fe *)0x122909;
    secp256k1_fe_verify(&local_188);
    psStack_1d0 = (secp256k1_fe *)0x122911;
    secp256k1_fe_verify(&local_188);
    psStack_1d0 = (secp256k1_fe *)0x12291e;
    secp256k1_fe_verify_magnitude(&local_188,2);
    local_188.n[0] = 0x5ffff9ffffe91a - local_188.n[0];
    local_188.n[1] = 0x5ffffffffffffa - local_188.n[1];
    local_188.n[2] = 0x5ffffffffffffa - local_188.n[2];
    local_188.n[3] = 0x5ffffffffffffa - local_188.n[3];
    local_188.n[4] = 0x5fffffffffffa - local_188.n[4];
    local_188.magnitude = 3;
    local_188.normalized = 0;
    psStack_1d0 = (secp256k1_fe *)0x122966;
    secp256k1_fe_verify(&local_188);
    psStack_1d0 = (secp256k1_fe *)0x12296e;
    iVar2 = secp256k1_ge_x_on_curve_var(&local_188);
    psVar5 = local_1c0;
    psVar11 = (secp256k1_fe *)0x0;
    if (iVar2 != 0) goto LAB_001232ab;
    psVar8 = &local_188;
    psStack_1d0 = (secp256k1_fe *)0x122993;
    secp256k1_fe_sqr(&local_1b8,psVar8);
    psStack_1d0 = (secp256k1_fe *)0x12299b;
    secp256k1_fe_verify(&local_1b8);
    psStack_1d0 = (secp256k1_fe *)0x1229a8;
    secp256k1_fe_verify_magnitude(&local_1b8,1);
    local_1b8.n[0] = 0x3ffffbfffff0bc - local_1b8.n[0];
    local_1b8.n[1] = 0x3ffffffffffffc - local_1b8.n[1];
    local_1b8.n[2] = 0x3ffffffffffffc - local_1b8.n[2];
    local_1b8.n[3] = 0x3ffffffffffffc - local_1b8.n[3];
    local_1b8.n[4] = 0x3fffffffffffc - local_1b8.n[4];
    local_1b8.magnitude = 2;
    local_1b8.normalized = 0;
    psStack_1d0 = (secp256k1_fe *)0x1229f0;
    secp256k1_fe_verify(&local_1b8);
    a = &local_128;
    psStack_1d0 = (secp256k1_fe *)0x122a05;
    secp256k1_fe_mul(psVar8,a,&local_158);
    psStack_1d0 = (secp256k1_fe *)0x122a0d;
    secp256k1_fe_verify(&local_1b8);
    psStack_1d0 = (secp256k1_fe *)0x122a15;
    secp256k1_fe_verify(psVar8);
    if (local_188.magnitude + local_1b8.magnitude < 0x21) {
      local_1b8.n[0] = local_1b8.n[0] + local_188.n[0];
      local_1b8.n[1] = local_1b8.n[1] + local_188.n[1];
      local_1b8.n[2] = local_1b8.n[2] + local_188.n[2];
      local_1b8.n[3] = local_1b8.n[3] + local_188.n[3];
      local_1b8.n[4] = local_1b8.n[4] + local_188.n[4];
      local_1b8.normalized = 0;
      local_1b8.magnitude = local_188.magnitude + local_1b8.magnitude;
      psStack_1d0 = (secp256k1_fe *)0x122a6b;
      secp256k1_fe_verify(&local_1b8);
      psStack_1d0 = (secp256k1_fe *)0x122a73;
      secp256k1_fe_verify(&local_1b8);
      uVar3 = (local_1b8.n[4] >> 0x30) * 0x1000003d1 + local_1b8.n[0];
      if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
        uVar4 = (uVar3 >> 0x34) + local_1b8.n[1];
        a = (secp256k1_fe *)((uVar4 >> 0x34) + local_1b8.n[2]);
        psVar8 = (secp256k1_fe *)(((ulong)a >> 0x34) + local_1b8.n[3]);
        uVar6 = ((ulong)psVar8 >> 0x34) + (local_1b8.n[4] & 0xffffffffffff);
        if ((((uVar4 | uVar3 | (ulong)a | (ulong)psVar8) & 0xfffffffffffff) == 0 && uVar6 == 0) ||
           ((uVar3 + 0x1000003d0 & uVar4 & (ulong)a & (ulong)psVar8 & (uVar6 ^ 0xf000000000000)) ==
            0xfffffffffffff)) goto LAB_001232fc;
      }
      psStack_1d0 = (secp256k1_fe *)0x122b3f;
      secp256k1_fe_sqr(&local_c8,&local_128);
      psStack_1d0 = (secp256k1_fe *)0x122b4d;
      secp256k1_fe_mul(&local_c8,&local_c8,&local_128);
      psStack_1d0 = (secp256k1_fe *)0x122b55;
      secp256k1_fe_verify(&local_c8);
      local_c8.n[0] = local_c8.n[0] + 7;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      psStack_1d0 = (secp256k1_fe *)0x122b6d;
      secp256k1_fe_verify(&local_c8);
      psStack_1d0 = (secp256k1_fe *)0x122b82;
      secp256k1_fe_mul(&local_188,&local_1b8,&local_c8);
      psStack_1d0 = (secp256k1_fe *)0x122b8a;
      iVar2 = secp256k1_fe_is_square_var(&local_188);
      if (iVar2 == 0) goto LAB_001232ab;
      psVar11 = &local_1b8;
      psStack_1d0 = (secp256k1_fe *)0x122ba5;
      secp256k1_fe_inv_var(psVar11,psVar11);
      psStack_1d0 = (secp256k1_fe *)0x122bb8;
      secp256k1_fe_mul(psVar11,psVar11,&local_c8);
      local_f8.n[4] = local_158.n[4];
      local_f8.magnitude = local_158.magnitude;
      local_f8.normalized = local_158.normalized;
      local_f8.n[2] = local_158.n[2];
      local_f8.n[3] = local_158.n[3];
      local_f8.n[0] = local_158.n[0];
      local_f8.n[1] = local_158.n[1];
      r_00 = psVar5;
LAB_00123166:
      psVar8 = &local_188;
      a = &local_1b8;
      psStack_1d0 = (secp256k1_fe *)0x123175;
      iVar2 = secp256k1_fe_sqrt(psVar8,a);
      if (iVar2 == 0) goto LAB_001232e3;
      if (((uVar1 & 5) == 5) || ((uVar1 & 5) == 0)) {
        psStack_1d0 = (secp256k1_fe *)0x123199;
        secp256k1_fe_verify(&local_188);
        psStack_1d0 = (secp256k1_fe *)0x1231a6;
        secp256k1_fe_verify_magnitude(&local_188,1);
        local_188.n[0] = 0x3ffffbfffff0bc - local_188.n[0];
        local_188.n[1] = 0x3ffffffffffffc - local_188.n[1];
        local_188.n[2] = 0x3ffffffffffffc - local_188.n[2];
        local_188.n[3] = 0x3ffffffffffffc - local_188.n[3];
        local_188.n[4] = 0x3fffffffffffc - local_188.n[4];
        local_188.magnitude = 2;
        local_188.normalized = 0;
        psStack_1d0 = (secp256k1_fe *)0x1231ee;
        secp256k1_fe_verify(&local_188);
      }
      psVar8 = &secp256k1_ellswift_c4;
      if ((uVar1 & 1) == 0) {
        psVar8 = &secp256k1_ellswift_c3;
      }
      psVar11 = &local_128;
      psStack_1d0 = (secp256k1_fe *)0x123217;
      a = psVar11;
      secp256k1_fe_mul(psVar11,psVar11,psVar8);
      psStack_1d0 = (secp256k1_fe *)0x12321f;
      secp256k1_fe_verify(psVar11);
      psVar8 = &local_f8;
      psStack_1d0 = (secp256k1_fe *)0x12322f;
      secp256k1_fe_verify(psVar8);
      if (local_f8.magnitude + local_128.magnitude < 0x21) {
        local_128.n[0] = local_128.n[0] + local_f8.n[0];
        local_128.n[1] = local_128.n[1] + local_f8.n[1];
        local_128.n[2] = (long)(uint64_t *)local_128.n[2] + local_f8.n[2];
        local_128.n[3] = local_128.n[3] + local_f8.n[3];
        local_128.n[4] = local_128.n[4] + local_f8.n[4];
        local_128.normalized = 0;
        local_128.magnitude = local_f8.magnitude + local_128.magnitude;
        psStack_1d0 = (secp256k1_fe *)0x123290;
        secp256k1_fe_verify(&local_128);
        psStack_1d0 = (secp256k1_fe *)0x1232a0;
        secp256k1_fe_mul(r_00,&local_188,&local_128);
        psVar11 = (secp256k1_fe *)0x1;
LAB_001232ab:
        return (int)psVar11;
      }
      goto LAB_001232e8;
    }
  }
  psStack_1d0 = (secp256k1_fe *)0x1232fc;
  secp256k1_ellswift_xswiftec_inv_var_cold_10();
LAB_001232fc:
  psStack_1d0 = (secp256k1_fe *)fe_equal;
  secp256k1_ellswift_xswiftec_inv_var_cold_7();
  sStack_210.n[0] = psVar8->n[0];
  sStack_210.n[1] = psVar8->n[1];
  sStack_210.n[2] = psVar8->n[2];
  sStack_210.n[3] = psVar8->n[3];
  sStack_210.n[4] = psVar8->n[4];
  sStack_210.magnitude = psVar8->magnitude;
  sStack_210.normalized = psVar8->normalized;
  sStack_240.n[0] = a->n[0];
  sStack_240.n[1] = a->n[1];
  sStack_240.n[2] = a->n[2];
  sStack_240.n[3] = a->n[3];
  sStack_240.n[4] = a->n[4];
  sStack_240.magnitude = a->magnitude;
  sStack_240.normalized = a->normalized;
  psStack_1d8 = psVar5;
  psStack_1d0 = psVar11;
  secp256k1_fe_verify(&sStack_210);
  uVar4 = (sStack_210.n[4] >> 0x30) * 0x1000003d1 + sStack_210.n[0];
  uVar3 = (uVar4 >> 0x34) + sStack_210.n[1];
  uVar6 = (uVar3 >> 0x34) + sStack_210.n[2];
  uVar7 = (uVar6 >> 0x34) + sStack_210.n[3];
  sStack_210.n[3] = uVar7 & 0xfffffffffffff;
  sStack_210.n[4] = (uVar7 >> 0x34) + (sStack_210.n[4] & 0xffffffffffff);
  sStack_210.n[2] = uVar6 & 0xfffffffffffff;
  sStack_210.n[1] = uVar3 & 0xfffffffffffff;
  sStack_210.n[0] = uVar4 & 0xfffffffffffff;
  sStack_210.magnitude = 1;
  secp256k1_fe_verify(&sStack_210);
  iVar2 = secp256k1_fe_equal(&sStack_210,&sStack_240);
  return iVar2;
}

Assistant:

static int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t, const secp256k1_fe *x_in, const secp256k1_fe *u_in, int c) {
    /* The implemented algorithm is this (all arithmetic, except involving c, is mod p):
     *
     * - If (c & 2) = 0:
     *   - If (-x-u) is a valid X coordinate, fail.
     *   - Let s=-(u^3+7)/(u^2+u*x+x^2).
     *   - If s is not square, fail.
     *   - Let v=x.
     * - If (c & 2) = 2:
     *   - Let s=x-u.
     *   - If s is not square, fail.
     *   - Let r=sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist.
     *   - If (c & 1) = 1 and r = 0, fail.
     *   - If s=0, fail.
     *   - Let v=(r/s-u)/2.
     * - Let w=sqrt(s).
     * - If (c & 5) = 0: return -w*(c3*u + v).
     * - If (c & 5) = 1: return  w*(c4*u + v).
     * - If (c & 5) = 4: return  w*(c3*u + v).
     * - If (c & 5) = 5: return -w*(c4*u + v).
     */
    secp256k1_fe x = *x_in, u = *u_in, g, v, s, m, r, q;
    int ret;

    secp256k1_fe_normalize_weak(&x);
    secp256k1_fe_normalize_weak(&u);

    VERIFY_CHECK(c >= 0 && c < 8);
    VERIFY_CHECK(secp256k1_ge_x_on_curve_var(&x));

    if (!(c & 2)) {
        /* c is in {0, 1, 4, 5}. In this case we look for an inverse under the x1 (if c=0 or
         * c=4) formula, or x2 (if c=1 or c=5) formula. */

        /* If -u-x is a valid X coordinate, fail. This would yield an encoding that roundtrips
         * back under the x3 formula instead (which has priority over x1 and x2, so the decoding
         * would not match x). */
        m = x;                                          /* m = x */
        secp256k1_fe_add(&m, &u);                       /* m = u+x */
        secp256k1_fe_negate(&m, &m, 2);                 /* m = -u-x */
        /* Test if (-u-x) is a valid X coordinate. If so, fail. */
        if (secp256k1_ge_x_on_curve_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [first part] */
        secp256k1_fe_sqr(&s, &m);                       /* s = (u+x)^2 */
        secp256k1_fe_negate(&s, &s, 1);                 /* s = -(u+x)^2 */
        secp256k1_fe_mul(&m, &u, &x);                   /* m = u*x */
        secp256k1_fe_add(&s, &m);                       /* s = -(u^2 + u*x + x^2) */

        /* Note that at this point, s = 0 is impossible. If it were the case:
         *             s = -(u^2 + u*x + x^2) = 0
         * =>                 u^2 + u*x + x^2 = 0
         * =>   (u + 2*x) * (u^2 + u*x + x^2) = 0
         * => 2*x^3 + 3*x^2*u + 3*x*u^2 + u^3 = 0
         * =>                 (x + u)^3 + x^3 = 0
         * =>                             x^3 = -(x + u)^3
         * =>                         x^3 + B = (-u - x)^3 + B
         *
         * However, we know x^3 + B is square (because x is on the curve) and
         * that (-u-x)^3 + B is not square (the secp256k1_ge_x_on_curve_var(&m)
         * test above would have failed). This is a contradiction, and thus the
         * assumption s=0 is false. */
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(&s));

        /* If s is not square, fail. We have not fully computed s yet, but s is square iff
         * -(u^3+7)*(u^2+u*x+x^2) is square (because a/b is square iff a*b is square and b is
         * nonzero). */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_add_int(&g, SECP256K1_B);          /* g = u^3+7 */
        secp256k1_fe_mul(&m, &s, &g);                   /* m = -(u^3 + 7)*(u^2 + u*x + x^2) */
        if (!secp256k1_fe_is_square_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [second part] */
        secp256k1_fe_inv_var(&s, &s);                   /* s = -1/(u^2 + u*x + x^2) [no div by 0] */
        secp256k1_fe_mul(&s, &s, &g);                   /* s = -(u^3 + 7)/(u^2 + u*x + x^2) */

        /* Let v = x. */
        v = x;
    } else {
        /* c is in {2, 3, 6, 7}. In this case we look for an inverse under the x3 formula. */

        /* Let s = x-u. */
        secp256k1_fe_negate(&m, &u, 1);                 /* m = -u */
        s = m;                                          /* s = -u */
        secp256k1_fe_add(&s, &x);                       /* s = x-u */

        /* If s is not square, fail. */
        if (!secp256k1_fe_is_square_var(&s)) return 0;

        /* Let r = sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist. */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&q, &s, &g);                   /* q = s*u^2 */
        secp256k1_fe_mul_int(&q, 3);                    /* q = 3*s*u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_mul_int(&g, 4);                    /* g = 4*u^3 */
        secp256k1_fe_add_int(&g, 4 * SECP256K1_B);      /* g = 4*(u^3+7) */
        secp256k1_fe_add(&q, &g);                       /* q = 4*(u^3+7)+3*s*u^2 */
        secp256k1_fe_mul(&q, &q, &s);                   /* q = s*(4*(u^3+7)+3*u^2*s) */
        secp256k1_fe_negate(&q, &q, 1);                 /* q = -s*(4*(u^3+7)+3*u^2*s) */
        if (!secp256k1_fe_is_square_var(&q)) return 0;
        ret = secp256k1_fe_sqrt(&r, &q);                /* r = sqrt(-s*(4*(u^3+7)+3*u^2*s)) */
#ifdef VERIFY
        VERIFY_CHECK(ret);
#else
        (void)ret;
#endif

        /* If (c & 1) = 1 and r = 0, fail. */
        if (EXPECT((c & 1) && secp256k1_fe_normalizes_to_zero_var(&r), 0)) return 0;

        /* If s = 0, fail. */
        if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&s), 0)) return 0;

        /* Let v = (r/s-u)/2. */
        secp256k1_fe_inv_var(&v, &s);                   /* v = 1/s [no div by 0] */
        secp256k1_fe_mul(&v, &v, &r);                   /* v = r/s */
        secp256k1_fe_add(&v, &m);                       /* v = r/s-u */
        secp256k1_fe_half(&v);                          /* v = (r/s-u)/2 */
    }

    /* Let w = sqrt(s). */
    ret = secp256k1_fe_sqrt(&m, &s);                    /* m = sqrt(s) = w */
    VERIFY_CHECK(ret);

    /* Return logic. */
    if ((c & 5) == 0 || (c & 5) == 5) {
        secp256k1_fe_negate(&m, &m, 1);                 /* m = -w */
    }
    /* Now m = {-w if c&5=0 or c&5=5; w otherwise}. */
    secp256k1_fe_mul(&u, &u, c&1 ? &secp256k1_ellswift_c4 : &secp256k1_ellswift_c3);
    /* u = {c4 if c&1=1; c3 otherwise}*u */
    secp256k1_fe_add(&u, &v);                           /* u = {c4 if c&1=1; c3 otherwise}*u + v */
    secp256k1_fe_mul(t, &m, &u);
    return 1;
}